

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multisig_tests.cpp
# Opt level: O2

void __thiscall multisig_tests::multisig_Sign::test_method(multisig_Sign *this)

{
  CKey *this_00;
  _Rb_tree_header *p_Var1;
  long lVar2;
  pointer pCVar3;
  long lVar4;
  CScript *pCVar5;
  int i;
  iterator in_R8;
  iterator in_R9;
  CMutableTransaction *in;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  check_type cVar6;
  undefined1 local_710 [16];
  undefined1 *local_700;
  string *local_6f8;
  assertion_result local_6f0;
  undefined1 *local_6d8;
  undefined1 *local_6d0;
  char *local_6c8;
  char *local_6c0;
  int local_6b4;
  CMutableTransaction txFrom;
  char *local_678;
  char *local_670;
  undefined1 *local_668;
  undefined1 *local_660;
  char *local_658;
  char *local_650;
  string local_648;
  CTransaction local_628;
  SignatureData empty;
  CMutableTransaction txTo [3];
  CScript escrow;
  CScript a_or_b;
  CScript a_and_b;
  CKey key [4];
  FillableSigningProvider keystore;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header;
  keystore.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FillableSigningProvider_01158ee0;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._8_8_ = 0;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__align = 0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __prev = (__pthread_internal_list *)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __next = (__pthread_internal_list *)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._16_8_ = 1;
  lVar4 = 0;
  do {
    (&key[0].fCompressed)[lVar4] = false;
    *(undefined8 *)
     ((long)&key[0].keydata._M_t.
             super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> + lVar4) = 0;
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x40);
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 0x10) {
    CKey::MakeNewKey((CKey *)(&key[0].fCompressed + lVar4),true);
    local_658 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
    ;
    local_650 = "";
    local_668 = &boost::unit_test::basic_cstring<char_const>::null;
    local_660 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0xbe;
    file.m_begin = (iterator)&local_658;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_668,msg);
    txTo[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start._0_1_ =
         FillableSigningProvider::AddKey(&keystore,(CKey *)(&key[0].fCompressed + lVar4));
    txTo[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    txTo[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_628.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0xbbf0ac;
    local_628.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0xbbf0c3;
    empty.scriptSig.super_CScriptBase._union.direct[0] = '\0';
    empty._0_8_ = &PTR__lazy_ostream_011481f0;
    empty.scriptSig.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst;
    empty.scriptSig.super_CScriptBase._union._16_8_ = &local_628;
    local_678 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
    ;
    local_670 = "";
    in_R8 = &DAT_00000001;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)txTo,(lazy_ostream *)&empty,1,0,WARN,_cVar6,(size_t)&local_678,
               0xbe);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &txTo[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  a_and_b.super_CScriptBase._union._16_8_ = 0;
  a_and_b.super_CScriptBase._24_8_ = 0;
  a_and_b.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  a_and_b.super_CScriptBase._union._8_8_ = 0;
  pCVar5 = CScript::operator<<(&a_and_b,OP_2);
  CKey::GetPubKey((CPubKey *)&empty,key);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_628,(CPubKey *)&empty);
  pCVar5 = CScript::operator<<(pCVar5,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      &local_628);
  this_00 = key + 1;
  CKey::GetPubKey((CPubKey *)txTo,this_00);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&txFrom,(CPubKey *)txTo);
  pCVar5 = CScript::operator<<(pCVar5,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      &txFrom);
  pCVar5 = CScript::operator<<(pCVar5,OP_2);
  CScript::operator<<(pCVar5,OP_CHECKMULTISIG);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&txFrom);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_628);
  a_or_b.super_CScriptBase._union._16_8_ = 0;
  a_or_b.super_CScriptBase._24_8_ = 0;
  a_or_b.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  a_or_b.super_CScriptBase._union._8_8_ = 0;
  pCVar5 = CScript::operator<<(&a_or_b,OP_1);
  CKey::GetPubKey((CPubKey *)&empty,key);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_628,(CPubKey *)&empty);
  pCVar5 = CScript::operator<<(pCVar5,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      &local_628);
  CKey::GetPubKey((CPubKey *)txTo,this_00);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&txFrom,(CPubKey *)txTo);
  pCVar5 = CScript::operator<<(pCVar5,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      &txFrom);
  pCVar5 = CScript::operator<<(pCVar5,OP_2);
  CScript::operator<<(pCVar5,OP_CHECKMULTISIG);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&txFrom);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_628);
  escrow.super_CScriptBase._union._16_8_ = 0;
  escrow.super_CScriptBase._24_8_ = 0;
  escrow.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  escrow.super_CScriptBase._union._8_8_ = 0;
  pCVar5 = CScript::operator<<(&escrow,OP_2);
  CKey::GetPubKey((CPubKey *)&empty,key);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&txFrom,(CPubKey *)&empty);
  pCVar5 = CScript::operator<<(pCVar5,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      &txFrom);
  CKey::GetPubKey((CPubKey *)txTo,this_00);
  in = txTo;
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_710,(CPubKey *)in);
  pCVar5 = CScript::operator<<(pCVar5,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      local_710);
  CKey::GetPubKey((CPubKey *)&local_628,key + 2);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_648,
             (CPubKey *)&local_628);
  pCVar5 = CScript::operator<<(pCVar5,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      &local_648);
  pCVar5 = CScript::operator<<(pCVar5,OP_3);
  CScript::operator<<(pCVar5,OP_CHECKMULTISIG);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_648);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_710);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&txFrom);
  CMutableTransaction::CMutableTransaction(&txFrom);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&txFrom.vout,3);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             &a_and_b.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[1].scriptPubKey.super_CScriptBase,
             &a_or_b.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&txFrom.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[2].scriptPubKey.super_CScriptBase,
             &escrow.super_CScriptBase);
  lVar4 = 0;
  do {
    CMutableTransaction::CMutableTransaction
              ((CMutableTransaction *)
               ((long)&txTo[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + 0x38;
  } while (lVar4 != 0xa8);
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&in->vin,1);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&in->vout,1);
    (((in->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).n = (uint32_t)lVar4;
    CMutableTransaction::GetHash((Txid *)&empty,&txFrom);
    pCVar3 = (in->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
    *(undefined8 *)((long)&(pCVar3->prevout).hash + 0x10) =
         empty.scriptSig.super_CScriptBase._union._8_8_;
    *(undefined8 *)((long)&(pCVar3->prevout).hash + 0x18) =
         empty.scriptSig.super_CScriptBase._union._16_8_;
    *(undefined8 *)&(pCVar3->prevout).hash = empty._0_8_;
    *(ulong *)((long)&(pCVar3->prevout).hash + 8) =
         CONCAT71(empty.scriptSig.super_CScriptBase._union._1_7_,
                  empty.scriptSig.super_CScriptBase._union.direct[0]);
    ((in->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start)->nValue = 1;
    in = in + 1;
  }
  p_Var1 = &empty.hash160_preimages._M_t._M_impl.super__Rb_tree_header;
  for (local_6b4 = 0; local_6b4 < 3; local_6b4 = local_6b4 + 1) {
    empty._0_8_ = empty._0_8_ & 0xffffffffffff0000;
    empty.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    empty.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    memset(&empty.scriptSig,0,0xb8);
    empty.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &empty.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header;
    empty.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    empty.tr_builder.super__Optional_base<TaprootBuilder,_false,_false>._M_payload.
    super__Optional_payload<TaprootBuilder,_true,_false,_false>.
    super__Optional_payload_base<TaprootBuilder>._M_engaged = false;
    empty.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    empty.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    empty.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &empty.signatures._M_t._M_impl.super__Rb_tree_header._M_header;
    empty.signatures._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    empty.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    empty.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    empty.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &empty.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
    empty.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    empty.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    empty.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    empty.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    empty.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    empty.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    empty.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &empty.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header;
    empty.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    empty.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    empty.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    empty.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &empty.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
    empty.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    empty.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    empty.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    empty.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &empty.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
    empty.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    empty.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    empty.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    empty.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    empty.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    empty.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    empty.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    empty.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    empty.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0] = '\0';
    empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[1] = '\0';
    empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[2] = '\0';
    empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[3] = '\0';
    empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[4] = '\0';
    empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[5] = '\0';
    empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[6] = '\0';
    empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[7] = '\0';
    empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[8] = '\0';
    empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[9] = '\0';
    empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[10] = '\0';
    empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
    empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
    empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
    empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
    empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
    empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
    empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
    empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
    empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    empty.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &empty.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
    empty.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    empty.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    empty.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    empty.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &empty.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
    empty.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    empty.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    empty.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    empty.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &empty.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
    empty.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    empty.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    empty.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    empty.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_6c8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
    ;
    local_6c0 = "";
    local_6d8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_6d0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0xdd;
    file_00.m_begin = (iterator)&local_6c8;
    msg_00.m_end = in_R9;
    msg_00.m_begin = in_R8;
    empty.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         empty.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    empty.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         empty.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    empty.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         empty.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    empty.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         empty.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    empty.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         empty.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    empty.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         empty.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    empty.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         empty.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    empty.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         empty.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    empty.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         empty.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    empty.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    empty.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_6d8,
               msg_00);
    CTransaction::CTransaction(&local_628,&txFrom);
    local_6f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         SignSignature(&keystore.super_SigningProvider,&local_628,txTo + local_6b4,0,1,&empty);
    local_6f0.m_message.px = (element_type *)0x0;
    local_6f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    tinyformat::format<int>(&local_648,"SignSignature %d",&local_6b4);
    local_710[8] = false;
    local_710._0_8_ = &PTR__lazy_ostream_01147fb0;
    local_700 = boost::unit_test::lazy_ostream::inst;
    in_R8 = &DAT_00000001;
    in_R9 = &DAT_00000001;
    local_6f8 = &local_648;
    boost::test_tools::tt_detail::report_assertion
              (&local_6f0,(lazy_ostream *)local_710,1,1,WARN,0xbbee57,
               (size_t)&stack0xfffffffffffff8e0,0xdd);
    std::__cxx11::string::~string((string *)&local_648);
    boost::detail::shared_count::~shared_count(&local_6f0.m_message.pn);
    CTransaction::~CTransaction(&local_628);
    SignatureData::~SignatureData(&empty);
  }
  lVar4 = 0x70;
  do {
    CMutableTransaction::~CMutableTransaction
              ((CMutableTransaction *)
               ((long)&txTo[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x38;
  } while (lVar4 != -0x38);
  CMutableTransaction::~CMutableTransaction(&txFrom);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&escrow.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&a_or_b.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&a_and_b.super_CScriptBase);
  lVar4 = 0x38;
  do {
    std::
    unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ::~unique_ptr((unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                   *)(&key[0].fCompressed + lVar4));
    lVar4 = lVar4 + -0x10;
  } while (lVar4 != -8);
  FillableSigningProvider::~FillableSigningProvider(&keystore);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(multisig_Sign)
{
    // Test SignSignature() (and therefore the version of Solver() that signs transactions)
    FillableSigningProvider keystore;
    CKey key[4];
    for (int i = 0; i < 4; i++)
    {
        key[i].MakeNewKey(true);
        BOOST_CHECK(keystore.AddKey(key[i]));
    }

    CScript a_and_b;
    a_and_b << OP_2 << ToByteVector(key[0].GetPubKey()) << ToByteVector(key[1].GetPubKey()) << OP_2 << OP_CHECKMULTISIG;

    CScript a_or_b;
    a_or_b  << OP_1 << ToByteVector(key[0].GetPubKey()) << ToByteVector(key[1].GetPubKey()) << OP_2 << OP_CHECKMULTISIG;

    CScript escrow;
    escrow << OP_2 << ToByteVector(key[0].GetPubKey()) << ToByteVector(key[1].GetPubKey()) << ToByteVector(key[2].GetPubKey()) << OP_3 << OP_CHECKMULTISIG;

    CMutableTransaction txFrom;  // Funding transaction
    txFrom.vout.resize(3);
    txFrom.vout[0].scriptPubKey = a_and_b;
    txFrom.vout[1].scriptPubKey = a_or_b;
    txFrom.vout[2].scriptPubKey = escrow;

    CMutableTransaction txTo[3]; // Spending transaction
    for (int i = 0; i < 3; i++)
    {
        txTo[i].vin.resize(1);
        txTo[i].vout.resize(1);
        txTo[i].vin[0].prevout.n = i;
        txTo[i].vin[0].prevout.hash = txFrom.GetHash();
        txTo[i].vout[0].nValue = 1;
    }

    for (int i = 0; i < 3; i++)
    {
        SignatureData empty;
        BOOST_CHECK_MESSAGE(SignSignature(keystore, CTransaction(txFrom), txTo[i], 0, SIGHASH_ALL, empty), strprintf("SignSignature %d", i));
    }
}